

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basics_gen.c
# Opt level: O2

GDBusObjectManager *
object_manager_client_new_sync
          (GDBusConnection *connection,GDBusObjectManagerClientFlags flags,gchar *name,
          gchar *object_path,GCancellable *cancellable,GError **error)

{
  GType GVar1;
  long lVar2;
  undefined8 uVar3;
  GDBusObjectManager *pGVar4;
  
  GVar1 = object_manager_client_get_type();
  lVar2 = g_initable_new(GVar1,cancellable,error,"flags",flags,"name",name,"connection",connection,
                         "object-path",object_path,"get-proxy-type-func",
                         object_manager_client_get_proxy_type,0);
  if (lVar2 != 0) {
    uVar3 = g_dbus_object_manager_get_type();
    pGVar4 = (GDBusObjectManager *)g_type_check_instance_cast(lVar2,uVar3);
    return pGVar4;
  }
  return (GDBusObjectManager *)0x0;
}

Assistant:

GDBusObjectManager *
object_manager_client_new_sync (
    GDBusConnection        *connection,
    GDBusObjectManagerClientFlags  flags,
    const gchar            *name,
    const gchar            *object_path,
    GCancellable           *cancellable,
    GError                **error)
{
  GInitable *ret;
  ret = g_initable_new (TYPE_OBJECT_MANAGER_CLIENT, cancellable, error, "flags", flags, "name", name, "connection", connection, "object-path", object_path, "get-proxy-type-func", object_manager_client_get_proxy_type, NULL);
  if (ret != NULL)
    return G_DBUS_OBJECT_MANAGER (ret);
  else
    return NULL;
}